

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::write(arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *this,int __fd,void *__buf,size_t __n)

{
  format_specs *spec;
  void *__buf_00;
  ssize_t extraout_RAX;
  ssize_t sVar1;
  format_error *this_00;
  void *pvVar2;
  undefined4 in_register_00000034;
  char *__s;
  char *data;
  str_writer<char> local_20;
  
  __s = (char *)CONCAT44(in_register_00000034,__fd);
  if (__s == (char *)0x0) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,"string pointer is null");
    __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __buf_00 = (void *)strlen(__s);
  spec = this->specs_;
  if (spec != (format_specs *)0x0) {
    pvVar2 = (void *)(long)(spec->super_core_format_specs).precision;
    local_20.size_ = (size_t)__buf_00;
    if (pvVar2 < __buf_00) {
      local_20.size_ = (size_t)pvVar2;
    }
    if ((long)pvVar2 < 0) {
      local_20.size_ = (size_t)__buf_00;
    }
    local_20.s = __s;
    basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
    ::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::str_writer<char>>
              ((basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                *)this,&spec->super_align_spec,&local_20);
    return extraout_RAX;
  }
  sVar1 = basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
          ::write(&this->writer_,__fd,__buf_00,__n);
  return sVar1;
}

Assistant:

void write(const char_type *value) {
    if (!value)
      FMT_THROW(format_error("string pointer is null"));
    auto length = std::char_traits<char_type>::length(value);
    basic_string_view<char_type> sv(value, length);
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }